

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkSwapVariables(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 uVar5;
  long *plVar6;
  long lVar7;
  uint uVar8;
  Abc_Ntk_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Obj_t *pAVar11;
  ulong uVar12;
  long lVar13;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQuant.c"
                  ,0x126,"Abc_Ntk_t *Abc_NtkSwapVariables(Abc_Ntk_t *)");
  }
  iVar1 = pNtk->vPis->nSize;
  pAVar9 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  if (1 < iVar1) {
    uVar8 = iVar1 / 2;
    uVar12 = 0;
    do {
      iVar1 = pNtk->vPis->nSize;
      if (((long)iVar1 <= (long)uVar12) || (iVar1 <= (int)(uVar8 + (int)uVar12))) goto LAB_002f5377;
      ppvVar2 = pNtk->vPis->pArray;
      pvVar3 = ppvVar2[uVar12];
      pvVar4 = ppvVar2[uVar12 + uVar8];
      uVar5 = *(undefined8 *)((long)pvVar3 + 0x40);
      *(undefined8 *)((long)pvVar3 + 0x40) = *(undefined8 *)((long)pvVar4 + 0x40);
      *(undefined8 *)((long)pvVar4 + 0x40) = uVar5;
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      plVar6 = (long *)pVVar10->pArray[lVar13];
      if ((plVar6 != (long *)0x0) && (uVar8 = *(uint *)((long)plVar6 + 0x14), (uVar8 & 0xf) == 7)) {
        lVar7 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
        pAVar11 = Abc_AigAnd((Abc_Aig_t *)pAVar9->pManFunc,
                             (Abc_Obj_t *)
                             ((ulong)(uVar8 >> 10 & 1) ^
                             *(ulong *)(*(long *)(lVar7 + (long)*(int *)plVar6[4] * 8) + 0x40)),
                             (Abc_Obj_t *)
                             ((ulong)(uVar8 >> 0xb & 1) ^
                             *(ulong *)(*(long *)(lVar7 + (long)((int *)plVar6[4])[1] * 8) + 0x40)))
        ;
        plVar6[8] = (long)pAVar11;
      }
      lVar13 = lVar13 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar13 < pVVar10->nSize);
  }
  if ((0 < pNtk->vPos->nSize) && (0 < pAVar9->vPos->nSize)) {
    plVar6 = (long *)*pNtk->vPos->pArray;
    Abc_ObjAddFanin((Abc_Obj_t *)*pAVar9->vPos->pArray,
                    (Abc_Obj_t *)
                    ((ulong)(*(uint *)((long)plVar6 + 0x14) >> 10 & 1) ^
                    *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                        (long)*(int *)plVar6[4] * 8) + 0x40)));
    return pAVar9;
  }
LAB_002f5377:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSwapVariables( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pMiter, * pObj, * pObj0, * pObj1;
    int i, nVars = Abc_NtkPiNum(pNtk)/2;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network 
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // update the PIs
    for ( i = 0; i < nVars; i++ )
    {
        pObj0 = Abc_NtkPi( pNtk, i );
        pObj1 = Abc_NtkPi( pNtk, i+nVars );
        pMiter = pObj0->pCopy;
        pObj0->pCopy = pObj1->pCopy;
        pObj1->pCopy = pMiter;
    }
    // restrash
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // add the PO
    pMiter = Abc_ObjChild0Copy( Abc_NtkPo(pNtk,0) );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), pMiter );
    return pNtkNew;
}